

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

uint256 * __thiscall
jbcoin::STObject::getSigningHash(uint256 *__return_storage_ptr__,STObject *this,uint32_t prefix)

{
  undefined1 local_30 [8];
  Serializer s;
  uint32_t prefix_local;
  STObject *this_local;
  
  s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = prefix;
  Serializer::Serializer((Serializer *)local_30,0x100);
  Serializer::add32((Serializer *)local_30,
                    s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  add(this,(Serializer *)local_30,false);
  Serializer::getSHA512Half(__return_storage_ptr__,(Serializer *)local_30);
  Serializer::~Serializer((Serializer *)local_30);
  return __return_storage_ptr__;
}

Assistant:

uint256 STObject::getSigningHash (std::uint32_t prefix) const
{
    Serializer s;
    s.add32 (prefix);
    add (s, false);
    return s.getSHA512Half ();
}